

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

programCollectionForFunction * __thiscall
glcts::TextureCubeMapArraySamplingTest::programCollectionForFormat::getPrograms
          (programCollectionForFormat *this,samplingFunction function)

{
  samplingFunction function_local;
  programCollectionForFormat *this_local;
  
  switch(function) {
  case Texture:
    this_local = this;
    break;
  case TextureLod:
    this_local = (programCollectionForFormat *)&this->m_programs_for_textureLod;
    break;
  case TextureGrad:
    this_local = (programCollectionForFormat *)&this->m_programs_for_textureGrad;
    break;
  case TextureGather:
    this_local = (programCollectionForFormat *)&this->m_programs_for_textureGather;
    break;
  default:
    this_local = (programCollectionForFormat *)0x0;
  }
  return &this_local->m_programs_for_texture;
}

Assistant:

const TextureCubeMapArraySamplingTest::programCollectionForFunction* TextureCubeMapArraySamplingTest::
	programCollectionForFormat::getPrograms(samplingFunction function) const
{
	switch (function)
	{
	case Texture:
		return &m_programs_for_texture;
		break;
	case TextureLod:
		return &m_programs_for_textureLod;
		break;
	case TextureGrad:
		return &m_programs_for_textureGrad;
		break;
	case TextureGather:
		return &m_programs_for_textureGather;
		break;
	};

	return 0;
}